

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

int __thiscall embree::FileStream::next(FileStream *this)

{
  int iVar1;
  long in_RDI;
  int c;
  
  iVar1 = std::istream::get();
  if (iVar1 == 10) {
    *(long *)(in_RDI + 0x248) = *(long *)(in_RDI + 0x248) + 1;
    *(undefined8 *)(in_RDI + 0x250) = 0;
  }
  else if (iVar1 != 0xd) {
    *(long *)(in_RDI + 0x250) = *(long *)(in_RDI + 0x250) + 1;
  }
  *(long *)(in_RDI + 600) = *(long *)(in_RDI + 600) + 1;
  return iVar1;
}

Assistant:

int next() {
      int c = ifs.get();
      if (c == '\n') { lineNumber++; colNumber = 0; } else if (c != '\r') colNumber++;
      charNumber++;
      return c;
    }